

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3WriteSegment(Fts3Table *p,sqlite3_int64 iBlock,char *z,int n)

{
  int iVar1;
  sqlite3_stmt *pStmt;
  
  iVar1 = fts3SqlStmt(p,9,&pStmt,(sqlite3_value **)0x0);
  if (iVar1 == 0) {
    sqlite3_bind_int64(pStmt,1,iBlock);
    sqlite3_bind_blob(pStmt,2,z,n,(_func_void_void_ptr *)0x0);
    sqlite3_step(pStmt);
    iVar1 = sqlite3_reset(pStmt);
    sqlite3_bind_null(pStmt,2);
  }
  return iVar1;
}

Assistant:

static int fts3WriteSegment(
  Fts3Table *p,                   /* Virtual table handle */
  sqlite3_int64 iBlock,           /* Block id for new block */
  char *z,                        /* Pointer to buffer containing block data */
  int n                           /* Size of buffer z in bytes */
){
  sqlite3_stmt *pStmt;
  int rc = fts3SqlStmt(p, SQL_INSERT_SEGMENTS, &pStmt, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pStmt, 1, iBlock);
    sqlite3_bind_blob(pStmt, 2, z, n, SQLITE_STATIC);
    sqlite3_step(pStmt);
    rc = sqlite3_reset(pStmt);
    sqlite3_bind_null(pStmt, 2);
  }
  return rc;
}